

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCPluginAPI.cxx
# Opt level: O0

void cmSourceFileAddDepend(void *arg,char *depend)

{
  cmSourceFile *this;
  allocator local_81;
  value_type local_80;
  allocator local_49;
  string local_48;
  cmSourceFile *local_28;
  cmSourceFile *rsf;
  cmCPluginAPISourceFile *sf;
  char *depend_local;
  void *arg_local;
  
  this = *arg;
  local_28 = this;
  rsf = (cmSourceFile *)arg;
  sf = (cmCPluginAPISourceFile *)depend;
  depend_local = (char *)arg;
  if (this == (cmSourceFile *)0x0) {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_80,depend,&local_81);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::push_back((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)((long)arg + 0x68),&local_80);
    std::__cxx11::string::~string((string *)&local_80);
    std::allocator<char>::~allocator((allocator<char> *)&local_81);
  }
  else {
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)&local_48,depend,&local_49);
    cmSourceFile::AddDepend(this,&local_48);
    std::__cxx11::string::~string((string *)&local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return;
}

Assistant:

void CCONV cmSourceFileAddDepend(void *arg, const char *depend)
{
  cmCPluginAPISourceFile* sf = static_cast<cmCPluginAPISourceFile*>(arg);
  if(cmSourceFile* rsf = sf->RealSourceFile)
    {
    rsf->AddDepend(depend);
    }
  else
    {
    sf->Depends.push_back(depend);
    }
}